

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O1

Config * __thiscall QPDFJob::Config::removeUnreferencedResources(Config *this,string *parameter)

{
  int iVar1;
  string local_38;
  
  iVar1 = std::__cxx11::string::compare((char *)parameter);
  if (iVar1 == 0) {
    ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    remove_unreferenced_page_resources = re_auto;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)parameter);
    if (iVar1 == 0) {
      ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      remove_unreferenced_page_resources = re_yes;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)parameter);
      if (iVar1 == 0) {
        ((this->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        remove_unreferenced_page_resources = re_no;
      }
      else {
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_38,"invalid value for --remove-unreferenced-page-resources","");
        usage(&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::removeUnreferencedResources(std::string const& parameter)
{
    if (parameter == "auto") {
        o.m->remove_unreferenced_page_resources = QPDFJob::re_auto;
    } else if (parameter == "yes") {
        o.m->remove_unreferenced_page_resources = QPDFJob::re_yes;
    } else if (parameter == "no") {
        o.m->remove_unreferenced_page_resources = QPDFJob::re_no;
    } else {
        usage("invalid value for --remove-unreferenced-page-resources");
    }
    return this;
}